

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O2

int LS_Thing_Deactivate(line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,
                       int arg4)

{
  uint uVar1;
  AActor *thing;
  AActor *pAVar2;
  int iVar3;
  FActorIterator iterator;
  
  if (arg0 == 0) {
    if (it == (AActor *)0x0) {
      uVar1 = 0;
    }
    else {
      DoDeactivateThing(it,it);
      uVar1 = 1;
    }
  }
  else {
    iterator.base = (AActor *)0x0;
    iterator.id = arg0;
    thing = FActorIterator::Next(&iterator);
    iVar3 = 0;
    while (thing != (AActor *)0x0) {
      pAVar2 = FActorIterator::Next(&iterator);
      DoDeactivateThing(thing,it);
      iVar3 = iVar3 + -1;
      thing = pAVar2;
    }
    uVar1 = (uint)(iVar3 != 0);
  }
  return uVar1;
}

Assistant:

FUNC(LS_Thing_Deactivate)
// Thing_Deactivate (tid)
{
	if (arg0 != 0)
	{
		AActor *actor;
		FActorIterator iterator (arg0);
		int count = 0;
	
		actor = iterator.Next ();
		while (actor)
		{
			// Actor might removes itself as part of deactivation, so get next
			// one before we activate it.
			AActor *temp = iterator.Next ();
			DoDeactivateThing(actor, it);
			actor = temp;
			count++;
		}
	
		return count != 0;
	}
	else if (it != NULL)
	{
		DoDeactivateThing(it, it);
		return true;
	}
	return false;
}